

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O0

void __thiscall CTcGenTarg::add_debug_line_table(CTcGenTarg *this,ulong ofs)

{
  char cVar1;
  ulong uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  unsigned_long in_RSI;
  long in_RDI;
  tct3_debug_line_page *pg;
  uchar *p;
  size_t idx;
  
  uVar2 = *(ulong *)(in_RDI + 0xb0) & 0x3ff;
  if (uVar2 == 0) {
    puVar3 = (undefined8 *)malloc(0x1408);
    *puVar3 = 0;
    if (*(long *)(in_RDI + 0xa8) == 0) {
      *(undefined8 **)(in_RDI + 0xa0) = puVar3;
    }
    else {
      **(undefined8 **)(in_RDI + 0xa8) = puVar3;
    }
    *(undefined8 **)(in_RDI + 0xa8) = puVar3;
  }
  pcVar4 = (char *)(*(long *)(in_RDI + 0xa8) + 8 + uVar2 * 5);
  cVar1 = CTcDataStream::get_stream_id(&G_cs->super_CTcDataStream);
  *pcVar4 = cVar1;
  ::oswp4(pcVar4 + 1,in_RSI);
  *(long *)(in_RDI + 0xb0) = *(long *)(in_RDI + 0xb0) + 1;
  return;
}

Assistant:

void CTcGenTarg::add_debug_line_table(ulong ofs)
{
    size_t idx;
    uchar *p;

    /* calculate the index of the next free entry on its page */
    idx = (size_t)(debug_line_cnt_ % TCT3_DEBUG_LINE_PAGE_SIZE);

    /* 
     *   if we've completely filled the last page, allocate a new one - we
     *   know we've exhausted the page if we're at the start of a new page
     *   (i.e., the index is zero) 
     */
    if (idx == 0)
    {
        tct3_debug_line_page *pg;

        /* allocate the new page */
        pg = (tct3_debug_line_page *)t3malloc(sizeof(*pg));

        /* link it in at the end of the list */
        pg->nxt = 0;
        if (debug_line_tail_ == 0)
            debug_line_head_ = pg;
        else
            debug_line_tail_->nxt = pg;
        debug_line_tail_ = pg;
    }

    /* get a pointer to the entry */
    p = debug_line_tail_->line_ofs + (idx * TCT3_DEBUG_LINE_REC_SIZE);

    /* 
     *   set this entry - one byte for the code stream ID, then a UINT4 with
     *   the offset in the stream 
     */
    *p = G_cs->get_stream_id();
    oswp4(p + 1, ofs);

    /* count it */
    ++debug_line_cnt_;
}